

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.cpp
# Opt level: O2

bool __thiscall btVoronoiSimplexSolver::updateClosestVectorAndPoints(btVoronoiSimplexSolver *this)

{
  btVector3 *v2;
  btUsageBitfield *pbVar1;
  btSubSimplexClosestResult *finalResult;
  btScalar *s;
  btScalar *pbVar2;
  btScalar *pbVar3;
  btScalar *s_00;
  btUsageBitfield *pbVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  byte bVar13;
  float fVar14;
  float fVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar16;
  float fVar17;
  float fVar18;
  btVector3 bVar19;
  btVector3 bVar20;
  btVector3 bVar21;
  btVector3 bVar22;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  btVector3 local_68;
  btVector3 local_58;
  undefined1 local_48 [24];
  
  if (this->m_needsUpdate == false) {
    bVar13 = this->m_cachedValidClosest;
    goto LAB_00167aa4;
  }
  (this->m_cachedBC).m_barycentricCoords[0] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
  (this->m_cachedBC).m_degenerate = false;
  pbVar1 = &(this->m_cachedBC).m_usedVertices;
  *(byte *)pbVar1 = *(byte *)pbVar1 & 0xf0;
  this->m_needsUpdate = false;
  if (4 < (uint)this->m_numVertices) goto switchD_00167589_caseD_0;
  finalResult = &this->m_cachedBC;
  s = (this->m_cachedBC).m_barycentricCoords;
  pbVar1 = &(this->m_cachedBC).m_usedVertices;
  switch(this->m_numVertices) {
  case 0:
    goto switchD_00167589_caseD_0;
  case 1:
    uVar9 = *(undefined8 *)(this->m_simplexPointsP[0].m_floats + 2);
    uVar10 = *(undefined8 *)this->m_simplexPointsQ[0].m_floats;
    uVar11 = *(undefined8 *)(this->m_simplexPointsQ[0].m_floats + 2);
    *(undefined8 *)(this->m_cachedP1).m_floats = *(undefined8 *)this->m_simplexPointsP[0].m_floats;
    *(undefined8 *)((this->m_cachedP1).m_floats + 2) = uVar9;
    *(undefined8 *)(this->m_cachedP2).m_floats = uVar10;
    *(undefined8 *)((this->m_cachedP2).m_floats + 2) = uVar11;
    bVar19 = operator-(&this->m_cachedP1,&this->m_cachedP2);
    *&(this->m_cachedV).m_floats = bVar19.m_floats;
    (this->m_cachedBC).m_degenerate = false;
    pbVar1 = &(this->m_cachedBC).m_usedVertices;
    *(byte *)pbVar1 = *(byte *)pbVar1 & 0xf0;
    (this->m_cachedBC).m_barycentricCoords[0] = 1.0;
    (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
    break;
  case 2:
    v2 = this->m_simplexVectorW;
    local_68.m_floats[0] = 0.0;
    local_68.m_floats[1] = 0.0;
    local_68.m_floats[2] = 0.0;
    local_68.m_floats[3] = 0.0;
    bVar19 = operator-(&local_68,v2);
    bVar20 = operator-(this->m_simplexVectorW + 1,v2);
    fVar16 = bVar20.m_floats[2];
    fVar14 = bVar20.m_floats[0];
    fVar15 = bVar20.m_floats[1];
    local_b8 = bVar19.m_floats[2];
    local_a8 = bVar19.m_floats[0];
    fStack_a4 = bVar19.m_floats[1];
    fVar18 = local_b8 * fVar16 + fStack_a4 * fVar15 + fVar14 * local_a8;
    fVar17 = 0.0;
    bVar13 = 1;
    if (0.0 < fVar18) {
      fVar17 = fVar16 * fVar16 + fVar14 * fVar14 + fVar15 * fVar15;
      if (fVar17 <= fVar18) {
        fVar17 = 1.0;
        bVar13 = 2;
      }
      else {
        fVar17 = fVar18 / fVar17;
        bVar13 = 3;
      }
    }
    pbVar4 = &(this->m_cachedBC).m_usedVertices;
    *(byte *)pbVar4 = *(byte *)pbVar4 | bVar13;
    (this->m_cachedBC).m_barycentricCoords[0] = 1.0 - fVar17;
    (this->m_cachedBC).m_barycentricCoords[1] = fVar17;
    (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
    local_58.m_floats[1] = fVar15 * fVar17;
    local_58.m_floats[0] = fVar14 * fVar17;
    local_58.m_floats[2] = fVar16 * fVar17;
    local_58.m_floats[3] = 0.0;
    operator+(v2,&local_58);
    bVar19 = operator-(this->m_simplexPointsP + 1,this->m_simplexPointsP);
    local_58.m_floats[1] = bVar19.m_floats[1] * fVar17;
    local_58.m_floats[0] = bVar19.m_floats[0] * fVar17;
    local_58.m_floats[2] = bVar19.m_floats[2] * fVar17;
    local_58.m_floats[3] = 0.0;
    bVar19 = operator+(this->m_simplexPointsP,&local_58);
    *&(this->m_cachedP1).m_floats = bVar19.m_floats;
    bVar19 = operator-(this->m_simplexPointsQ + 1,this->m_simplexPointsQ);
    local_58.m_floats[1] = bVar19.m_floats[1] * fVar17;
    local_58.m_floats[0] = bVar19.m_floats[0] * fVar17;
    local_58.m_floats[2] = bVar19.m_floats[2] * fVar17;
    local_58.m_floats[3] = 0.0;
    bVar19 = operator+(this->m_simplexPointsQ,&local_58);
    *&(this->m_cachedP2).m_floats = bVar19.m_floats;
    bVar19 = operator-(&this->m_cachedP1,&this->m_cachedP2);
    *&(this->m_cachedV).m_floats = bVar19.m_floats;
LAB_00167a91:
    reduceVertices(this,pbVar1);
    break;
  case 3:
    local_68.m_floats[0] = 0.0;
    local_68.m_floats[1] = 0.0;
    local_68.m_floats[2] = 0.0;
    local_68.m_floats[3] = 0.0;
    closestPtPointTriangle
              (this,&local_68,this->m_simplexVectorW,this->m_simplexVectorW + 1,
               this->m_simplexVectorW + 2,finalResult);
    bVar19 = operator*(this->m_simplexPointsP,s);
    pbVar2 = (this->m_cachedBC).m_barycentricCoords + 1;
    bVar20 = operator*(this->m_simplexPointsP + 1,pbVar2);
    local_b8 = bVar19.m_floats[2];
    pbVar3 = (this->m_cachedBC).m_barycentricCoords + 2;
    bVar21 = operator*(this->m_simplexPointsP + 2,pbVar3);
    local_98 = bVar20.m_floats[0];
    fStack_94 = bVar20.m_floats[1];
    local_a8 = bVar19.m_floats[0];
    fStack_a4 = bVar19.m_floats[1];
    auVar7._4_4_ = fStack_94 + fStack_a4 + bVar21.m_floats[1];
    auVar7._0_4_ = local_98 + local_a8 + bVar21.m_floats[0];
    auVar7._8_4_ = bVar21.m_floats[2] + bVar20.m_floats[2] + local_b8;
    auVar7._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar7;
    bVar19 = operator*(this->m_simplexPointsQ,s);
    bVar20 = operator*(this->m_simplexPointsQ + 1,pbVar2);
    local_98 = bVar19.m_floats[2];
    bVar21 = operator*(this->m_simplexPointsQ + 2,pbVar3);
    local_78 = bVar20.m_floats[0];
    fStack_74 = bVar20.m_floats[1];
    local_b8 = bVar19.m_floats[0];
    fStack_b4 = bVar19.m_floats[1];
    auVar8._4_4_ = fStack_74 + fStack_b4 + bVar21.m_floats[1];
    auVar8._0_4_ = local_78 + local_b8 + bVar21.m_floats[0];
    auVar8._8_4_ = bVar21.m_floats[2] + bVar20.m_floats[2] + local_98;
    auVar8._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar8;
    bVar19 = operator-(&this->m_cachedP1,&this->m_cachedP2);
    *&(this->m_cachedV).m_floats = bVar19.m_floats;
    reduceVertices(this,pbVar1);
    break;
  case 4:
    local_68.m_floats[0] = 0.0;
    local_68.m_floats[1] = 0.0;
    local_68.m_floats[2] = 0.0;
    local_68.m_floats[3] = 0.0;
    bVar12 = closestPtPointTetrahedron
                       (this,&local_68,this->m_simplexVectorW,this->m_simplexVectorW + 1,
                        this->m_simplexVectorW + 2,this->m_simplexVectorW + 3,finalResult);
    if (bVar12) {
      bVar19 = operator*(this->m_simplexPointsP,s);
      pbVar2 = (this->m_cachedBC).m_barycentricCoords + 1;
      bVar20 = operator*(this->m_simplexPointsP + 1,pbVar2);
      local_a8 = bVar19.m_floats[2];
      pbVar3 = (this->m_cachedBC).m_barycentricCoords + 2;
      bVar21 = operator*(this->m_simplexPointsP + 2,pbVar3);
      s_00 = (this->m_cachedBC).m_barycentricCoords + 3;
      bVar22 = operator*(this->m_simplexPointsP + 3,s_00);
      local_98 = bVar20.m_floats[0];
      fStack_94 = bVar20.m_floats[1];
      local_b8 = bVar19.m_floats[0];
      fStack_b4 = bVar19.m_floats[1];
      local_88 = bVar21.m_floats[0];
      fStack_84 = bVar21.m_floats[1];
      auVar5._4_4_ = fStack_94 + fStack_b4 + fStack_84 + bVar22.m_floats[1];
      auVar5._0_4_ = local_98 + local_b8 + local_88 + bVar22.m_floats[0];
      auVar5._8_4_ = bVar22.m_floats[2] + bVar21.m_floats[2] + bVar20.m_floats[2] + local_a8;
      auVar5._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar5;
      bVar19 = operator*(this->m_simplexPointsQ,s);
      bVar20 = operator*(this->m_simplexPointsQ + 1,pbVar2);
      local_88 = bVar19.m_floats[2];
      bVar21 = operator*(this->m_simplexPointsQ + 2,pbVar3);
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_8_ = bVar21.m_floats._0_8_;
      local_48._12_4_ = extraout_XMM0_Dd;
      bVar22 = operator*(this->m_simplexPointsQ + 3,s_00);
      local_78 = bVar20.m_floats[0];
      fStack_74 = bVar20.m_floats[1];
      local_98 = bVar19.m_floats[0];
      fStack_94 = bVar19.m_floats[1];
      auVar6._4_4_ = fStack_74 + fStack_94 + (float)local_48._4_4_ + bVar22.m_floats[1];
      auVar6._0_4_ = local_78 + local_98 + (float)local_48._0_4_ + bVar22.m_floats[0];
      auVar6._8_4_ = bVar22.m_floats[2] + bVar21.m_floats[2] + bVar20.m_floats[2] + local_88;
      auVar6._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar6;
      bVar19 = operator-(&this->m_cachedP1,&this->m_cachedP2);
      *&(this->m_cachedV).m_floats = bVar19.m_floats;
      goto LAB_00167a91;
    }
    if ((this->m_cachedBC).m_degenerate != true) {
      this->m_cachedValidClosest = true;
      (this->m_cachedV).m_floats[0] = 0.0;
      (this->m_cachedV).m_floats[1] = 0.0;
      (this->m_cachedV).m_floats[2] = 0.0;
      (this->m_cachedV).m_floats[3] = 0.0;
      bVar13 = 1;
      goto LAB_00167aa4;
    }
    goto switchD_00167589_caseD_0;
  }
  bVar13 = btSubSimplexClosestResult::isValid(finalResult);
  this->m_cachedValidClosest = (bool)bVar13;
LAB_00167aa4:
  return (bool)(bVar13 & 1);
switchD_00167589_caseD_0:
  this->m_cachedValidClosest = false;
  bVar13 = 0;
  goto LAB_00167aa4;
}

Assistant:

bool	btVoronoiSimplexSolver::updateClosestVectorAndPoints()
{
	
	if (m_needsUpdate)
	{
		m_cachedBC.reset();

		m_needsUpdate = false;

		switch (numVertices())
		{
		case 0:
				m_cachedValidClosest = false;
				break;
		case 1:
			{
				m_cachedP1 = m_simplexPointsP[0];
				m_cachedP2 = m_simplexPointsQ[0];
				m_cachedV = m_cachedP1-m_cachedP2; //== m_simplexVectorW[0]
				m_cachedBC.reset();
				m_cachedBC.setBarycentricCoordinates(btScalar(1.),btScalar(0.),btScalar(0.),btScalar(0.));
				m_cachedValidClosest = m_cachedBC.isValid();
				break;
			};
		case 2:
			{
			//closest point origin from line segment
					const btVector3& from = m_simplexVectorW[0];
					const btVector3& to = m_simplexVectorW[1];
					btVector3 nearest;

					btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
					btVector3 diff = p - from;
					btVector3 v = to - from;
					btScalar t = v.dot(diff);
					
					if (t > 0) {
						btScalar dotVV = v.dot(v);
						if (t < dotVV) {
							t /= dotVV;
							diff -= t*v;
							m_cachedBC.m_usedVertices.usedVertexA = true;
							m_cachedBC.m_usedVertices.usedVertexB = true;
						} else {
							t = 1;
							diff -= v;
							//reduce to 1 point
							m_cachedBC.m_usedVertices.usedVertexB = true;
						}
					} else
					{
						t = 0;
						//reduce to 1 point
						m_cachedBC.m_usedVertices.usedVertexA = true;
					}
					m_cachedBC.setBarycentricCoordinates(1-t,t);
					nearest = from + t*v;

					m_cachedP1 = m_simplexPointsP[0] + t * (m_simplexPointsP[1] - m_simplexPointsP[0]);
					m_cachedP2 = m_simplexPointsQ[0] + t * (m_simplexPointsQ[1] - m_simplexPointsQ[0]);
					m_cachedV = m_cachedP1 - m_cachedP2;
					
					reduceVertices(m_cachedBC.m_usedVertices);

					m_cachedValidClosest = m_cachedBC.isValid();
					break;
			}
		case 3: 
			{ 
				//closest point origin from triangle 
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.)); 

				const btVector3& a = m_simplexVectorW[0]; 
				const btVector3& b = m_simplexVectorW[1]; 
				const btVector3& c = m_simplexVectorW[2]; 

				closestPtPointTriangle(p,a,b,c,m_cachedBC); 
				m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedV = m_cachedP1-m_cachedP2; 

				reduceVertices (m_cachedBC.m_usedVertices); 
				m_cachedValidClosest = m_cachedBC.isValid(); 

				break; 
			}
		case 4:
			{

				
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
				
				const btVector3& a = m_simplexVectorW[0];
				const btVector3& b = m_simplexVectorW[1];
				const btVector3& c = m_simplexVectorW[2];
				const btVector3& d = m_simplexVectorW[3];

				bool hasSeperation = closestPtPointTetrahedron(p,a,b,c,d,m_cachedBC);

				if (hasSeperation)
				{

					m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsP[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsQ[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedV = m_cachedP1-m_cachedP2;
					reduceVertices (m_cachedBC.m_usedVertices);
				} else
				{
//					printf("sub distance got penetration\n");

					if (m_cachedBC.m_degenerate)
					{
						m_cachedValidClosest = false;
					} else
					{
						m_cachedValidClosest = true;
						//degenerate case == false, penetration = true + zero
						m_cachedV.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
					}
					break;
				}

				m_cachedValidClosest = m_cachedBC.isValid();

				//closest point origin from tetrahedron
				break;
			}
		default:
			{
				m_cachedValidClosest = false;
			}
		};
	}

	return m_cachedValidClosest;

}